

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_concurrent.hpp
# Opt level: O3

void boost::unordered::detail::foa::
     concurrent_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
     ::delete_(undefined8 param_1,long param_2)

{
  if (*(long *)(param_2 + 0x18) != 0) {
    operator_delete(*(void **)(param_2 + 0x20),*(long *)(param_2 + 8) * 8 + 8);
    if (*(void **)(param_2 + 0x18) != (void *)0x0) {
      operator_delete(*(void **)(param_2 + 0x18),
                      ((*(long *)(param_2 + 8) * 0x178 + 0x186U) / 3 & 0xfffffffffffffff8) * 3);
      return;
    }
  }
  return;
}

Assistant:

static void delete_group_access(group_access_allocator_type al,
                                    concurrent_table_arrays& arrays) noexcept {
        if (arrays.elements()) {
            std::allocator_traits<std::remove_cvref_t<decltype(al)>>::deallocate(
                al, arrays.group_accesses_, arrays.groups_size_mask + 1);
        }
    }